

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O3

unique_ptr<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
MCTS::compute_tree<GoState<3u,3u>>
          (GoState<3U,_3U> *root_state,ComputeOptions options,result_type initial_seed)

{
  int iVar1;
  result_type rVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Node<GoState<3U,_3U>_> *pNVar6;
  runtime_error *this;
  long lVar7;
  ulong in_RDX;
  int iVar8;
  double dVar9;
  GoState<3U,_3U> state;
  mt19937_64 random_engine;
  Move local_a6c;
  Node<GoState<3U,_3U>_> *local_a68;
  result_type local_a60;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_a58;
  uchar (*local_a50) [3];
  GoState<3U,_3U> local_a48;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  lVar7 = 1;
  do {
    in_RDX = (in_RDX >> 0x3e ^ in_RDX) * 0x5851f42d4c957f2d + lVar7;
    local_9f8._M_x[lVar7] = in_RDX;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x138);
  local_9f8._M_p = 0x138;
  if ((options.max_iterations < 0) && (options.max_time < 0.0)) {
    assertion_failed("options.max_iterations >= 0 || options.max_time >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x135);
  }
  if (0.0 <= options.max_time) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = *(int *)(initial_seed + 0x4c);
  if (1 < iVar8 - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x13c);
  }
  pNVar6 = (Node<GoState<3U,_3U>_> *)operator_new(0x60);
  pNVar6->move = -2;
  pNVar6->parent = (Node<GoState<3U,_3U>_> *)0x0;
  pNVar6->player_to_move = iVar8;
  pNVar6->wins = 0.0;
  pNVar6->visits = 0;
  (**(code **)(*(long *)initial_seed + 0x60))(&pNVar6->moves,initial_seed);
  (pNVar6->children).
  super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar6->UCT_score = 0.0;
  (pNVar6->children).
  super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar6->children).
  super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  root_state->_vptr_GoState = (_func_int **)pNVar6;
  GoState<3U,_3U>::GoState(&local_a48);
  if (options.max_iterations != 0) {
    local_a50 = (uchar (*) [3])(initial_seed + 8);
    local_a58 = (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)(initial_seed + 0x18);
    iVar8 = 1;
    local_a68 = pNVar6;
    local_a60 = initial_seed;
    do {
      rVar2 = local_a60;
      pNVar6 = local_a68;
      local_a48.board._0_8_ = *(undefined8 *)local_a50;
      local_a48._16_8_ = *(undefined8 *)(local_a50[2] + 2);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::operator=(&local_a48.all_hash_values._M_t,local_a58);
      local_a48._72_8_ = *(undefined8 *)(rVar2 + 0x48);
      while ((pNVar6->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (pNVar6->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        if ((pNVar6->children).
            super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (pNVar6->children).
            super__Vector_base<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001463d6;
        pNVar6 = Node<GoState<3U,_3U>_>::select_child_UCT(pNVar6);
        GoState<3U,_3U>::do_move(&local_a48,pNVar6->move);
      }
      local_a6c = Node<GoState<3u,3u>>::
                  get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                            ((Node<GoState<3u,3u>> *)pNVar6,&local_9f8);
      GoState<3U,_3U>::do_move(&local_a48,local_a6c);
      pNVar6 = Node<GoState<3U,_3U>_>::add_child(pNVar6,&local_a6c,&local_a48);
LAB_001463d6:
      while( true ) {
        bVar3 = GoState<3U,_3U>::has_moves(&local_a48);
        if (!bVar3) break;
        GoState<3u,3u>::
        do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                  ((GoState<3u,3u> *)&local_a48,&local_9f8);
      }
      for (; pNVar6 != (Node<GoState<3U,_3U>_> *)0x0; pNVar6 = pNVar6->parent) {
        iVar1 = pNVar6->player_to_move;
        iVar4 = (*local_a48._vptr_GoState[0xd])(&local_a48,1);
        iVar5 = (*local_a48._vptr_GoState[0xd])(&local_a48,2);
        dVar9 = 0.5;
        if ((iVar4 != iVar5) && (dVar9 = 0.0, (iVar4 <= iVar5) + 1 != iVar1)) {
          dVar9 = 1.0;
        }
        pNVar6->visits = pNVar6->visits + 1;
        pNVar6->wins = dVar9 + pNVar6->wins;
      }
      bVar3 = iVar8 != options.max_iterations;
      iVar8 = iVar8 + 1;
    } while (bVar3);
  }
  local_a48._vptr_GoState = (_func_int **)&PTR__GoState_001629d0;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_a48.all_hash_values._M_t);
  return (__uniq_ptr_data<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>,_true,_true>
          )(__uniq_ptr_data<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>,_true,_true>
            )root_state;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}